

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O0

size_t __thiscall
MADPComponentDiscreteObservations::GetNrObservations
          (MADPComponentDiscreteObservations *this,Index agentI)

{
  ostream *poVar1;
  undefined8 uVar2;
  size_type sVar3;
  const_reference pvVar4;
  E *this_00;
  uint in_ESI;
  long in_RDI;
  stringstream ss_1;
  stringstream ss;
  stringstream *in_stack_fffffffffffffc78;
  E *in_stack_fffffffffffffc80;
  stringstream local_330 [16];
  ostream local_320 [392];
  stringstream local_198 [16];
  ostream local_188 [380];
  uint local_c;
  
  local_c = in_ESI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"MADPComponentDiscreteObservations::GetNrObservations(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
  if (in_ESI < sVar3) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40),
                        (ulong)local_c);
    return *pvVar4;
  }
  std::__cxx11::stringstream::stringstream(local_330);
  poVar1 = std::operator<<(local_320,
                           "Warning: MADPComponentDiscreteObservations::GetNrObservations(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  poVar1 = std::operator<<(poVar1,") - index out of bounds");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,in_stack_fffffffffffffc78);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteObservations::GetNrObservations(Index agentI) const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteObservations::GetNrObservations("<< 
            agentI<<") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(agentI < _m_nrObservations.size())
        return _m_nrObservations[agentI];
    else
    {
        stringstream ss;
        ss << "Warning: MADPComponentDiscreteObservations::GetNrObservations("<<
            agentI<<") - index out of bounds"<<endl;
        throw E(ss);
    }
}